

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::passModel(Highs *this,HighsModel *model)

{
  HighsModel *this_00;
  HighsHessian *this_01;
  HighsLogOptions *log_options;
  pointer piVar1;
  pointer pdVar2;
  bool bVar3;
  HighsStatus HVar4;
  HighsStatus HVar5;
  HighsInt HVar6;
  HighsStatus HVar7;
  allocator local_1f9;
  string local_1f8;
  HighsOptions *local_1d8;
  string local_1d0;
  HighsLogOptions local_1b0;
  HighsLogOptions local_150;
  HighsLogOptions local_f0;
  HighsLogOptions local_90;
  
  logHeader(this);
  if (((this->options_).super_HighsOptionsStruct.highs_analysis_level & 1) != 0) {
    analyseLp(&(this->options_).super_HighsOptionsStruct.log_options,&model->lp_);
  }
  clearModel(this);
  this_00 = &this->model_;
  this_01 = &(this->model_).hessian_;
  HighsLp::operator=(&this_00->lp_,&model->lp_);
  HighsHessian::operator=(this_01,&model->hessian_);
  HVar7 = kError;
  if (((this->model_).lp_.num_col_ == 0) || ((this->model_).lp_.num_row_ == 0)) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                 "Model has either no columns or no rows, so ignoring user constraint matrix data and initialising empty matrix\n"
                );
    (this->model_).lp_.a_matrix_.format_ = kColwise;
    local_1f8._M_dataplus._M_p._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&(this->model_).lp_.a_matrix_.start_,(long)(this->model_).lp_.num_col_ + 1,
               (value_type_conflict2 *)&local_1f8);
    piVar1 = (this->model_).lp_.a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&(this->model_).lp_.a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data + 8) != piVar1) {
      *(pointer *)
       ((long)&(this->model_).lp_.a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data + 8) = piVar1;
    }
    pdVar2 = (this->model_).lp_.a_matrix_.value_.super__Vector_base<double,_std::allocator<double>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&(this->model_).lp_.a_matrix_.value_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
         + 8) != pdVar2) {
      *(pointer *)
       ((long)&(this->model_).lp_.a_matrix_.value_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data +
       8) = pdVar2;
    }
  }
  else {
    bVar3 = HighsSparseMatrix::formatOk(&(this->model_).lp_.a_matrix_);
    if (!bVar3) {
      return kError;
    }
  }
  HighsLp::setMatrixDimensions(&this_00->lp_);
  HighsLp::resetScale(&this_00->lp_);
  std::__cxx11::string::string((string *)&local_1d0,"passModel",(allocator *)&local_1f8);
  log_options = &(this->options_).super_HighsOptionsStruct.log_options;
  bVar3 = lpDimensionsOk(&local_1d0,&this_00->lp_,log_options);
  std::__cxx11::string::~string((string *)&local_1d0);
  if ((bVar3) && ((this->model_).hessian_.format_ - kTriangular < 2)) {
    HighsLogOptions::HighsLogOptions(&local_90,log_options);
    local_1d8 = &this->options_;
    HVar4 = assessLp(&this_00->lp_,&this->options_);
    std::__cxx11::string::string((string *)&local_1f8,"assessLp",&local_1f9);
    HVar4 = interpretCallStatus(&local_90,HVar4,kOk,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::_Function_base::~_Function_base(&local_90.user_callback.super__Function_base);
    if (HVar4 != kError) {
      HighsSparseMatrix::ensureColwise(&(this->model_).lp_.a_matrix_);
      HighsLogOptions::HighsLogOptions(&local_f0,log_options);
      HVar5 = assessHessian(this_01,local_1d8);
      local_1d8 = (HighsOptions *)CONCAT44(local_1d8._4_4_,HVar5);
      std::__cxx11::string::string((string *)&local_1f8,"assessHessian",&local_1f9);
      HVar4 = interpretCallStatus(&local_f0,(HighsStatus)local_1d8,HVar4,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::_Function_base::~_Function_base(&local_f0.user_callback.super__Function_base);
      if (HVar4 != kError) {
        if (this_01->dim_ != 0) {
          HVar6 = HighsHessian::numNz(this_01);
          if (HVar6 == 0) {
            highsLogUser(log_options,kInfo,
                         "Hessian has dimension %d but no nonzeros, so is ignored\n",
                         (ulong)(uint)this_01->dim_);
            HighsHessian::clear(this_01);
          }
          if (this_01->dim_ != 0) {
            completeHessian((this_00->lp_).num_col_,this_01);
          }
        }
        HighsLogOptions::HighsLogOptions(&local_150,log_options);
        HVar7 = clearSolver(this);
        std::__cxx11::string::string((string *)&local_1f8,"clearSolver",&local_1f9);
        HVar7 = interpretCallStatus(&local_150,HVar7,HVar4,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::_Function_base::~_Function_base(&local_150.user_callback.super__Function_base);
        HighsLogOptions::HighsLogOptions(&local_1b0,log_options);
        HVar4 = optionChangeAction(this);
        std::__cxx11::string::string((string *)&local_1f8,"optionChangeAction",&local_1f9);
        HVar7 = interpretCallStatus(&local_1b0,HVar4,HVar7,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::_Function_base::~_Function_base(&local_1b0.user_callback.super__Function_base);
        HVar7 = returnFromHighs(this,HVar7);
      }
    }
  }
  return HVar7;
}

Assistant:

HighsStatus Highs::passModel(HighsModel model) {
  // This is the "master" Highs::passModel, in that all the others
  // (and readModel) eventually call it
  this->logHeader();
  // Possibly analyse the LP data
  if (kHighsAnalysisLevelModelData & options_.highs_analysis_level)
    analyseLp(options_.log_options, model.lp_);
  HighsStatus return_status = HighsStatus::kOk;
  // Clear the incumbent model and any associated data
  clearModel();
  HighsLp& lp = model_.lp_;
  HighsHessian& hessian = model_.hessian_;
  // Move the model's LP and Hessian to the internal LP and Hessian
  lp = std::move(model.lp_);
  hessian = std::move(model.hessian_);
  assert(lp.a_matrix_.formatOk());
  if (lp.num_col_ == 0 || lp.num_row_ == 0) {
    // Model constraint matrix has either no columns or no
    // rows. Clearly the matrix is empty, so may have no orientation
    // or starts assigned. HiGHS assumes that such a model will have
    // null starts, so make it column-wise
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Model has either no columns or no rows, so ignoring user "
                 "constraint matrix data and initialising empty matrix\n");
    lp.a_matrix_.format_ = MatrixFormat::kColwise;
    lp.a_matrix_.start_.assign(lp.num_col_ + 1, 0);
    lp.a_matrix_.index_.clear();
    lp.a_matrix_.value_.clear();
  } else {
    // Matrix has rows and columns, so a_matrix format must be valid
    if (!lp.a_matrix_.formatOk()) return HighsStatus::kError;
  }
  // Dimensions in a_matrix_ may not be set, so take them from lp.
  lp.setMatrixDimensions();
  // Residual scale factors may be present. ToDo Allow user-defined
  // scale factors to be passed
  assert(!lp.is_scaled_);
  assert(!lp.is_moved_);
  lp.resetScale();
  // Check that the LP array dimensions are valid
  if (!lpDimensionsOk("passModel", lp, options_.log_options))
    return HighsStatus::kError;
  // Check that the Hessian format is valid
  if (!hessian.formatOk()) return HighsStatus::kError;
  // Check validity of the LP, normalising its values
  return_status = interpretCallStatus(
      options_.log_options, assessLp(lp, options_), return_status, "assessLp");
  if (return_status == HighsStatus::kError) return return_status;
  // Now legality of matrix is established, ensure that it is
  // column-wise
  lp.ensureColwise();
  // Check validity of any Hessian, normalising its entries
  return_status = interpretCallStatus(options_.log_options,
                                      assessHessian(hessian, options_),
                                      return_status, "assessHessian");
  if (return_status == HighsStatus::kError) return return_status;
  if (hessian.dim_) {
    // Clear any zero Hessian
    if (hessian.numNz() == 0) {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Hessian has dimension %" HIGHSINT_FORMAT
                   " but no nonzeros, so is ignored\n",
                   hessian.dim_);
      hessian.clear();
    }
  }
  // Ensure that any non-zero Hessian of dimension less than the
  // number of columns in the model is completed
  if (hessian.dim_) completeHessian(this->model_.lp_.num_col_, hessian);
  // Clear solver status, solution, basis and info associated with any
  // previous model; clear any HiGHS model object; create a HiGHS
  // model object for this LP
  return_status = interpretCallStatus(options_.log_options, clearSolver(),
                                      return_status, "clearSolver");
  // Apply any user scaling in call to optionChangeAction
  return_status =
      interpretCallStatus(options_.log_options, optionChangeAction(),
                          return_status, "optionChangeAction");
  return returnFromHighs(return_status);
}